

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O3

mraa_boolean_t mraa_file_contains_both(char *filename,char *content,char *content2)

{
  char *pcVar1;
  FILE *__stream;
  __ssize_t _Var2;
  char *pcVar3;
  mraa_boolean_t mVar4;
  char *line;
  size_t len;
  char *local_48;
  char *local_40;
  size_t local_38;
  
  mVar4 = 0;
  if ((content != (char *)0x0 && filename != (char *)0x0) &&
     (pcVar1 = mraa_file_unglob(filename), pcVar1 != (char *)0x0)) {
    mVar4 = 0;
    local_38 = 0;
    local_48 = (char *)0x0;
    __stream = fopen(pcVar1,"r");
    if (__stream == (FILE *)0x0) {
      free(pcVar1);
      mVar4 = 0;
    }
    else {
      _Var2 = getline(&local_48,&local_38,__stream);
      if (_Var2 != -1) {
        local_40 = pcVar1;
        do {
          pcVar1 = local_48;
          pcVar3 = strstr(local_48,content);
          if ((pcVar3 != (char *)0x0) && (pcVar1 = strstr(pcVar1,content2), pcVar1 != (char *)0x0))
          {
            mVar4 = 1;
            pcVar1 = local_40;
            break;
          }
          _Var2 = getline(&local_48,&local_38,__stream);
          pcVar1 = local_40;
        } while (_Var2 != -1);
      }
      fclose(__stream);
      free(pcVar1);
      free(local_48);
    }
  }
  return mVar4;
}

Assistant:

mraa_boolean_t
mraa_file_contains_both(const char* filename, const char* content, const char* content2)
{
    mraa_boolean_t found = 0;
    if ((filename == NULL) || (content == NULL)) {
        return 0;
    }

    char* file = mraa_file_unglob(filename);
    if (file != NULL) {
        size_t len = 0;
        char* line = NULL;
        FILE* fh = fopen(file, "r");
        if (fh == NULL) {
            free(file);
            return 0;
        }
        while ((getline(&line, &len, fh) != -1) && (found == 0)) {
            if (strstr(line, content) && strstr(line, content2)) {
                found = 1;
                break;
            }
        }
        fclose(fh);
        free(file);
        free(line);
    }
    return found;
}